

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusivePublication.h
# Opt level: O0

int64_t __thiscall
aeron::ExclusivePublication::offer
          (ExclusivePublication *this,AtomicBuffer *buffer,index_t offset,index_t length,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  bool bVar1;
  int64_t iVar2;
  pointer this_00;
  long currentPosition;
  int32_t local_4c;
  int32_t result;
  int64_t position;
  ExclusiveTermAppender *termAppender;
  int64_t limit;
  int64_t newPosition;
  on_reserved_value_supplier_t *reservedValueSupplier_local;
  index_t length_local;
  index_t offset_local;
  AtomicBuffer *buffer_local;
  ExclusivePublication *this_local;
  
  limit = -4;
  bVar1 = isClosed(this);
  if (!bVar1) {
    iVar2 = concurrent::status::ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>::
            getVolatile(&this->m_publicationLimit);
    this_00 = std::
              unique_ptr<aeron::concurrent::logbuffer::ExclusiveTermAppender,_std::default_delete<aeron::concurrent::logbuffer::ExclusiveTermAppender>_>
              ::get(this->m_appenders + this->m_activePartitionIndex);
    currentPosition = this->m_termBeginPosition + (long)this->m_termOffset;
    if (currentPosition < iVar2) {
      if (this->m_maxPayloadLength < length) {
        checkMaxMessageLength(this,length);
        local_4c = concurrent::logbuffer::ExclusiveTermAppender::appendFragmentedMessage
                             (this_00,this->m_termId,this->m_termOffset,&this->m_headerWriter,buffer
                              ,offset,length,this->m_maxPayloadLength,reservedValueSupplier);
      }
      else {
        local_4c = concurrent::logbuffer::ExclusiveTermAppender::appendUnfragmentedMessage
                             (this_00,this->m_termId,this->m_termOffset,&this->m_headerWriter,buffer
                              ,offset,length,reservedValueSupplier);
      }
      limit = ExclusivePublication::newPosition(this,local_4c);
    }
    else {
      limit = backPressureStatus(this,currentPosition,length);
    }
  }
  return limit;
}

Assistant:

inline std::int64_t offer(
        const concurrent::AtomicBuffer& buffer,
        util::index_t offset,
        util::index_t length,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        std::int64_t newPosition = PUBLICATION_CLOSED;

        if (!isClosed())
        {
            const std::int64_t limit = m_publicationLimit.getVolatile();
            ExclusiveTermAppender *termAppender = m_appenders[m_activePartitionIndex].get();
            const std::int64_t position = m_termBeginPosition + m_termOffset;

            if (position < limit)
            {
                std::int32_t result;
                if (length <= m_maxPayloadLength)
                {
                    result = termAppender->appendUnfragmentedMessage(
                        m_termId,
                        m_termOffset,
                        m_headerWriter,
                        buffer,
                        offset,
                        length,
                        reservedValueSupplier);
                }
                else
                {
                    checkMaxMessageLength(length);
                    result = termAppender->appendFragmentedMessage(
                        m_termId,
                        m_termOffset,
                        m_headerWriter,
                        buffer,
                        offset,
                        length,
                        m_maxPayloadLength,
                        reservedValueSupplier);
                }

                newPosition = ExclusivePublication::newPosition(result);
            }
            else
            {
                newPosition = ExclusivePublication::backPressureStatus(position, length);
            }
        }

        return newPosition;
    }